

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Constraints.cc
# Opt level: O3

void __thiscall
RigidBodyDynamics::ConstraintSet::SetActuationMap
          (ConstraintSet *this,Model *model,vector<bool,_std::allocator<bool>_> *actuatedDofUpd)

{
  uint uVar1;
  _Bit_type *p_Var2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  ulong cols;
  void *pvVar7;
  undefined8 *puVar8;
  ulong uVar9;
  long lVar10;
  uint uVar11;
  ActualDstType actualDst_1;
  ulong uVar12;
  long lVar13;
  uint uVar14;
  ulong uVar15;
  uint uVar16;
  ActualDstType actualDst;
  ActualDstType actualDst_5;
  ulong rows;
  Index new_rows_1;
  Index new_rows;
  
  uVar1 = model->dof_count;
  cols = (ulong)uVar1;
  p_Var2 = (actuatedDofUpd->super__Bvector_base<std::allocator<bool>_>)._M_impl.
           super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
  uVar9 = ((long)(actuatedDofUpd->super__Bvector_base<std::allocator<bool>_>)._M_impl.
                 super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p - (long)p_Var2) *
          8 + (ulong)(actuatedDofUpd->super__Bvector_base<std::allocator<bool>_>)._M_impl.
                     super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset;
  if (uVar9 == 0) {
    uVar14 = 0;
  }
  else {
    uVar12 = 0;
    uVar14 = 0;
    do {
      uVar14 = uVar14 + ((p_Var2[uVar12 >> 6 & 0x3ffffff] >> (uVar12 & 0x3f) & 1) != 0);
      uVar12 = uVar12 + 1;
    } while ((uVar12 & 0xffffffff) < uVar9);
  }
  lVar3 = *(long *)(this + 0x20);
  lVar4 = *(long *)(this + 0x28);
  uVar9 = (ulong)uVar14;
  Eigen::internal::
  conservative_resize_like_impl<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_false>
  ::run((DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)(this + 0x1e8),uVar9,cols);
  if (0 < *(long *)(this + 0x1f8) * *(long *)(this + 0x1f0)) {
    memset(*(void **)(this + 0x1e8),0,*(long *)(this + 0x1f8) * *(long *)(this + 0x1f0) * 8);
  }
  uVar12 = (ulong)(uVar1 - uVar14);
  Eigen::internal::
  conservative_resize_like_impl<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_false>
  ::run((DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)(this + 0x200),uVar12,
        (ulong)model->dof_count);
  if (0 < *(long *)(this + 0x210) * *(long *)(this + 0x208)) {
    memset(*(void **)(this + 0x200),0,*(long *)(this + 0x210) * *(long *)(this + 0x208) * 8);
  }
  Eigen::internal::
  conservative_resize_like_impl<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_false>
  ::run((DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)(this + 0x218),uVar9,uVar9);
  if (0 < *(long *)(this + 0x228) * *(long *)(this + 0x220)) {
    memset(*(void **)(this + 0x218),0,*(long *)(this + 0x228) * *(long *)(this + 0x220) * 8);
  }
  Eigen::internal::
  conservative_resize_like_impl<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_false>
  ::run((DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)(this + 0x230),uVar9,uVar9);
  if (0 < *(long *)(this + 0x240) * *(long *)(this + 0x238)) {
    memset(*(void **)(this + 0x230),0,*(long *)(this + 0x240) * *(long *)(this + 0x238) * 8);
  }
  Eigen::DenseStorage<double,_-1,_-1,_1,_0>::conservativeResize
            ((DenseStorage<double,__1,__1,_1,_0> *)(this + 0x248),uVar9,uVar9,1);
  if (0 < *(long *)(this + 0x250)) {
    memset(((DenseStorage<double,__1,__1,_1,_0> *)(this + 0x248))->m_data,0,
           *(long *)(this + 0x250) << 3);
  }
  if (*(ulong *)(this + 0x260) != uVar9) {
    free(*(void **)(this + 600));
    if (uVar9 == 0) {
      pvVar7 = (void *)0x0;
    }
    else {
      pvVar7 = malloc(uVar9 * 8);
      if (pvVar7 == (void *)0x0) goto LAB_0013a0fb;
    }
    *(void **)(this + 600) = pvVar7;
  }
  *(ulong *)(this + 0x260) = uVar9;
  if (*(ulong *)(this + 0x270) != uVar12) {
    free(*(void **)(this + 0x268));
    if (uVar1 == uVar14) {
      pvVar7 = (void *)0x0;
    }
    else {
      pvVar7 = malloc(uVar12 * 8);
      if (pvVar7 == (void *)0x0) {
LAB_0013a0fb:
        puVar8 = (undefined8 *)__cxa_allocate_exception(8);
        *puVar8 = operator_new;
        __cxa_throw(puVar8,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
      }
    }
    *(void **)(this + 0x268) = pvVar7;
  }
  *(ulong *)(this + 0x270) = uVar12;
  uVar14 = model->dof_count;
  if ((ulong)uVar14 != 0) {
    p_Var2 = (actuatedDofUpd->super__Bvector_base<std::allocator<bool>_>)._M_impl.
             super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
    lVar10 = *(long *)(this + 0x1e8);
    lVar5 = *(long *)(this + 0x1f0);
    lVar13 = *(long *)(this + 0x200);
    lVar6 = *(long *)(this + 0x208);
    uVar15 = 0;
    uVar16 = 0;
    uVar11 = 0;
    do {
      if ((p_Var2[uVar15 >> 6 & 0x3ffffff] >> (uVar15 & 0x3f) & 1) == 0) {
        *(undefined8 *)(lVar13 + (ulong)uVar16 * 8) = 0x3ff0000000000000;
        uVar16 = uVar16 + 1;
      }
      else {
        *(undefined8 *)(lVar10 + (ulong)uVar11 * 8) = 0x3ff0000000000000;
        uVar11 = uVar11 + 1;
      }
      uVar15 = uVar15 + 1;
      lVar10 = lVar10 + lVar5 * 8;
      lVar13 = lVar13 + lVar6 * 8;
    } while (uVar14 != uVar15);
  }
  Eigen::internal::
  conservative_resize_like_impl<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_false>
  ::run((DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)(this + 0x278),cols,cols);
  if (0 < *(long *)(this + 0x288) * *(long *)(this + 0x280)) {
    memset(*(void **)(this + 0x278),0,*(long *)(this + 0x288) * *(long *)(this + 0x280) * 8);
  }
  Eigen::internal::
  conservative_resize_like_impl<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_false>
  ::run((DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)(this + 0x290),uVar9,uVar9);
  if (0 < *(long *)(this + 0x2a0) * *(long *)(this + 0x298)) {
    memset(*(void **)(this + 0x290),0,*(long *)(this + 0x2a0) * *(long *)(this + 0x298) * 8);
  }
  Eigen::internal::
  conservative_resize_like_impl<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_false>
  ::run((DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)(this + 0x2a8),uVar9,uVar12);
  if (0 < *(long *)(this + 0x2b8) * *(long *)(this + 0x2b0)) {
    memset(*(void **)(this + 0x2a8),0,*(long *)(this + 0x2b8) * *(long *)(this + 0x2b0) * 8);
  }
  Eigen::internal::
  conservative_resize_like_impl<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_false>
  ::run((DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)(this + 0x2c0),uVar12,uVar9);
  if (0 < *(long *)(this + 0x2d0) * *(long *)(this + 0x2c8)) {
    memset(*(void **)(this + 0x2c0),0,*(long *)(this + 0x2d0) * *(long *)(this + 0x2c8) * 8);
  }
  Eigen::internal::
  conservative_resize_like_impl<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_false>
  ::run((DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)(this + 0x2d8),uVar12,uVar12);
  if (0 < *(long *)(this + 0x2e8) * *(long *)(this + 0x2e0)) {
    memset(*(void **)(this + 0x2d8),0,*(long *)(this + 0x2e8) * *(long *)(this + 0x2e0) * 8);
  }
  uVar15 = lVar4 - lVar3 >> 5;
  Eigen::DenseStorage<double,_-1,_-1,_1,_0>::conservativeResize
            ((DenseStorage<double,__1,__1,_1,_0> *)(this + 0x338),cols,cols,1);
  rows = uVar15 & 0xffffffff;
  Eigen::internal::
  conservative_resize_like_impl<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_false>
  ::run((DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)(this + 0x348),rows,rows);
  Eigen::DenseStorage<double,_-1,_-1,_1,_0>::conservativeResize
            ((DenseStorage<double,__1,__1,_1,_0> *)(this + 0x360),rows,rows,1);
  uVar15 = (ulong)(uVar1 - (int)uVar15);
  Eigen::DenseStorage<double,_-1,_-1,_1,_0>::conservativeResize
            ((DenseStorage<double,__1,__1,_1,_0> *)(this + 0x370),uVar15,uVar15,1);
  Eigen::internal::
  conservative_resize_like_impl<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_false>
  ::run((DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)(this + 0x2f0),cols,rows);
  Eigen::internal::
  conservative_resize_like_impl<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_false>
  ::run((DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)(this + 0x308),uVar9,rows);
  Eigen::internal::
  conservative_resize_like_impl<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_false>
  ::run((DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)(this + 800),uVar12,rows);
  Eigen::internal::
  conservative_resize_like_impl<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_false>
  ::run((DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)(this + 0x470),rows,uVar12);
  return;
}

Assistant:

void ConstraintSet::SetActuationMap(const Model &model,
                                    const std::vector<bool> &actuatedDofUpd)
{

  assert(actuatedDofUpd.size() == model.dof_count);

  unsigned int n  = unsigned( int( model.dof_count ));
  unsigned int nc = unsigned( int( name.size() ));
  unsigned int na = 0; //actuated dofs
  unsigned int nu = 0; //unactuated dofs

  for(unsigned int i=0; i<actuatedDofUpd.size(); ++i) {
    if(actuatedDofUpd[i]) {
      ++na;
    }
  }
  nu = n-na;

  S.conservativeResize(na,model.dof_count);
  S.setZero();
  P.conservativeResize(n-na,model.dof_count);
  P.setZero();
  W.conservativeResize(na,na);
  W.setZero();
  Winv.conservativeResize(na,na);
  Winv.setZero();
  WinvSC.conservativeResize(na);
  WinvSC.setZero();

  u.resize(na);
  v.resize(nu);

  unsigned int j=0;
  unsigned int k=0;
  for(unsigned int i=0; i<model.dof_count; ++i) {
    if(actuatedDofUpd[i]) {
      S(j,i) = 1.;
      ++j;
    } else {
      P(k,i) = 1.;
      ++k;
    }
  }

  unsigned int dim = n+n+nc+na;

  //Null space method variable initialization
  dim = na+nu;
  F.conservativeResize(dim,dim);
  F.setZero();

  Ful.conservativeResize(na,na);
  Ful.setZero();
  Fur.conservativeResize(na,nu);
  Fur.setZero();
  Fll.conservativeResize(nu,na);
  Fll.setZero();
  Flr.conservativeResize(nu,nu);
  Flr.setZero();

  g.conservativeResize(n);

  Ru.conservativeResize(nc,nc);
  py.conservativeResize(nc);
  pz.conservativeResize(n-nc);

  GT.conservativeResize(n,nc);
  GTu.conservativeResize(na,nc);
  GTl.conservativeResize(nu,nc);

  GPT.conservativeResize(nc,nu);

}